

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O0

void highsLogDev(HighsLogOptions *log_options_,HighsLogType type,char *format,...)

{
  char in_AL;
  bool bVar1;
  pointer pvVar2;
  size_type __maxlen;
  HighsCallbackDataOut *__args_2;
  undefined8 in_RCX;
  char *in_RDX;
  int in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  HighsCallbackDataOut data_out;
  int len;
  array<char,_1024UL> msgbuffer;
  bool use_log_callback;
  bool flush_streams;
  va_list argptr;
  void *in_stack_fffffffffffff9f8;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *in_stack_fffffffffffffa00;
  anon_struct_16_2_bb6a87e9 *__args_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  int in_stack_fffffffffffffa1c;
  int iVar3;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *in_stack_fffffffffffffa20;
  code *pcVar4;
  byte local_5ca;
  byte local_5c9;
  undefined1 local_5c8 [24];
  undefined8 local_5b0;
  undefined8 local_5a8;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined8 local_588;
  undefined8 local_578;
  undefined8 local_568;
  undefined8 local_558;
  undefined8 local_548;
  undefined8 local_538;
  undefined8 local_528;
  undefined1 local_4f9 [33];
  int local_4d8;
  int local_440;
  array<char,_1024UL> local_43a;
  byte local_3a;
  undefined1 local_39;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_18;
  int local_c;
  long *local_8;
  
  if (in_AL != '\0') {
    local_598 = in_XMM0_Qa;
    local_588 = in_XMM1_Qa;
    local_578 = in_XMM2_Qa;
    local_568 = in_XMM3_Qa;
    local_558 = in_XMM4_Qa;
    local_548 = in_XMM5_Qa;
    local_538 = in_XMM6_Qa;
    local_528 = in_XMM7_Qa;
  }
  if ((((*(byte *)in_RDI[1] & 1) != 0) &&
      ((((*in_RDI != 0 || ((*(byte *)in_RDI[2] & 1) != 0)) && (*(int *)in_RDI[3] != 0)) &&
       ((in_ESI != 2 || (1 < *(int *)in_RDI[3])))))) && ((in_ESI != 3 || (2 < *(int *)in_RDI[3]))))
  {
    local_28 = local_5c8;
    local_30 = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x18;
    local_39 = 1;
    local_5c9 = 1;
    local_5b0 = in_RCX;
    local_5a8 = in_R8;
    local_5a0 = in_R9;
    local_18 = in_RDX;
    local_c = in_ESI;
    local_8 = in_RDI;
    if (in_RDI[4] == 0) {
      bVar1 = std::function::operator_cast_to_bool(in_stack_fffffffffffffa00);
      local_5ca = 0;
      if (bVar1) {
        local_5ca = *(byte *)(local_8 + 0xb);
      }
      local_5c9 = local_5ca;
    }
    local_3a = local_5c9 & 1;
    if (local_3a == 0) {
      if (*local_8 != 0) {
        vfprintf((FILE *)*local_8,local_18,&local_38);
        fflush((FILE *)*local_8);
        local_28 = local_5c8;
        local_30 = &stack0x00000008;
        local_34 = 0x30;
        local_38 = 0x18;
      }
      if (((*(byte *)local_8[2] & 1) != 0) && ((FILE *)*local_8 != _stdout)) {
        vfprintf(_stdout,local_18,&local_38);
        fflush(_stdout);
      }
    }
    else {
      memset(&local_43a,0,0x400);
      pvVar2 = std::array<char,_1024UL>::data((array<char,_1024UL> *)0x45b789);
      __maxlen = std::array<char,_1024UL>::size(&local_43a);
      local_440 = vsnprintf(pvVar2,__maxlen,local_18,&local_38);
      if (local_8[4] == 0) {
        if ((*(byte *)(local_8 + 0xb) & 1) != 0) {
          local_4d8 = local_c;
          __args_3 = (anon_struct_16_2_bb6a87e9 *)(local_8 + 6);
          __args_2 = (HighsCallbackDataOut *)
                     std::array<char,_1024UL>::data((array<char,_1024UL> *)0x45b854);
          __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_4f9 + 1),(char *)__args_2,(allocator *)__args_1);
          std::
          function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
          ::operator()(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,__args_1,__args_2,
                       __args_3,in_stack_fffffffffffff9f8);
          std::__cxx11::string::~string((string *)(local_4f9 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_4f9);
        }
      }
      else {
        pcVar4 = (code *)local_8[4];
        iVar3 = local_c;
        pvVar2 = std::array<char,_1024UL>::data((array<char,_1024UL> *)0x45b7f7);
        (*pcVar4)(iVar3,pvVar2,local_8[5]);
      }
    }
  }
  return;
}

Assistant:

void highsLogDev(const HighsLogOptions& log_options_, const HighsLogType type,
                 const char* format, ...) {
  if (!*log_options_.output_flag ||
      (log_options_.log_stream == NULL && !*log_options_.log_to_console) ||
      !*log_options_.log_dev_level)
    return;
  // Always report HighsLogType::kInfo, HighsLogType::kWarning or
  // HighsLogType::kError
  //
  // Report HighsLogType::kDetailed if *log_options_.log_dev_level >=
  // kHighsLogDevLevelDetailed
  //
  // Report HighsLogType::kVerbose if *log_options_.log_dev_level >=
  // kHighsLogDevLevelVerbose
  if (type == HighsLogType::kDetailed &&
      *log_options_.log_dev_level < kHighsLogDevLevelDetailed)
    return;
  if (type == HighsLogType::kVerbose &&
      *log_options_.log_dev_level < kHighsLogDevLevelVerbose)
    return;
  va_list argptr;
  va_start(argptr, format);
  const bool flush_streams = true;
  const bool use_log_callback =
      log_options_.user_log_callback ||
      (log_options_.user_callback && log_options_.user_callback_active);
  if (!use_log_callback) {
    // Write to log file stream unless it is NULL
    if (log_options_.log_stream) {
      // Write to log file stream
      vfprintf(log_options_.log_stream, format, argptr);
      if (flush_streams) fflush(log_options_.log_stream);
      va_end(argptr);
      va_start(argptr, format);
    }
    // Write to stdout unless log file stream is stdout
    if (*log_options_.log_to_console && log_options_.log_stream != stdout) {
      vfprintf(stdout, format, argptr);
      if (flush_streams) fflush(stdout);
    }
  } else {
    std::array<char, kIoBufferSize> msgbuffer = {};
    int len = vsnprintf(msgbuffer.data(), msgbuffer.size(), format, argptr);
    // assert that there are no encoding errors
    assert(len >= 0);
    if (log_options_.user_log_callback) {
      log_options_.user_log_callback(type, msgbuffer.data(),
                                     log_options_.user_log_callback_data);
    } else if (log_options_.user_callback_active) {
      assert(log_options_.user_callback);
      HighsCallbackDataOut data_out;
      data_out.log_type = int(type);
      log_options_.user_callback(kCallbackLogging, msgbuffer.data(), &data_out,
                                 nullptr, log_options_.user_callback_data);
    }
  }
  va_end(argptr);
}